

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMotorRotationDriveline.cpp
# Opt level: O1

void __thiscall
chrono::ChLinkMotorRotationDriveline::ChLinkMotorRotationDriveline
          (ChLinkMotorRotationDriveline *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  ChShaftsBody *pCVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  undefined1 local_29;
  ChShaftsBody *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_20 [2];
  
  ChLinkMotorRotation::ChLinkMotorRotation(&this->super_ChLinkMotorRotation);
  *(undefined ***)
   &(this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.super_ChLinkMate.
    super_ChLink.super_ChLinkBase.super_ChPhysicsItem = &PTR__ChLinkMotorRotationDriveline_00b46af0;
  (this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.c_rz = false;
  *(undefined8 *)&(this->super_ChLinkMotorRotation).field_0x278 = 0;
  *(undefined8 *)&this->field_0x280 = 0;
  (this->innershaft2).super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->innershaft2).super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->innerconstraint1).super___shared_ptr<chrono::ChShaftsBody,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->innerconstraint1).super___shared_ptr<chrono::ChShaftsBody,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->innerconstraint2).super___shared_ptr<chrono::ChShaftsBody,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->innerconstraint2).super___shared_ptr<chrono::ChShaftsBody,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ChLinkMateGeneric::SetupLinkMask((ChLinkMateGeneric *)this);
  local_28 = (ChShaftsBody *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::ChShaft,std::allocator<chrono::ChShaft>>
            (a_Stack_20,(ChShaft **)&local_28,(allocator<chrono::ChShaft> *)&local_29);
  _Var3._M_pi = a_Stack_20[0]._M_pi;
  pCVar2 = local_28;
  local_28 = (ChShaftsBody *)0x0;
  a_Stack_20[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&this->field_0x280;
  *(ChShaftsBody **)&(this->super_ChLinkMotorRotation).field_0x278 = pCVar2;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&this->field_0x280 = _Var3._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  if (a_Stack_20[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_20[0]._M_pi);
  }
  local_28 = (ChShaftsBody *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::ChShaft,std::allocator<chrono::ChShaft>>
            (a_Stack_20,(ChShaft **)&local_28,(allocator<chrono::ChShaft> *)&local_29);
  _Var3._M_pi = a_Stack_20[0]._M_pi;
  pCVar2 = local_28;
  local_28 = (ChShaftsBody *)0x0;
  a_Stack_20[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (this->innershaft2).super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->innershaft2).super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)pCVar2;
  (this->innershaft2).super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var3._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  if (a_Stack_20[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_20[0]._M_pi);
  }
  local_28 = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::ChShaftsBody,std::allocator<chrono::ChShaftsBody>>
            (a_Stack_20,&local_28,(allocator<chrono::ChShaftsBody> *)&local_29);
  _Var3._M_pi = a_Stack_20[0]._M_pi;
  pCVar2 = local_28;
  local_28 = (ChShaftsBody *)0x0;
  a_Stack_20[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (this->innerconstraint1).
           super___shared_ptr<chrono::ChShaftsBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->innerconstraint1).super___shared_ptr<chrono::ChShaftsBody,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = pCVar2;
  (this->innerconstraint1).super___shared_ptr<chrono::ChShaftsBody,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var3._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  if (a_Stack_20[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_20[0]._M_pi);
  }
  local_28 = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::ChShaftsBody,std::allocator<chrono::ChShaftsBody>>
            (a_Stack_20,&local_28,(allocator<chrono::ChShaftsBody> *)&local_29);
  _Var3._M_pi = a_Stack_20[0]._M_pi;
  pCVar2 = local_28;
  local_28 = (ChShaftsBody *)0x0;
  a_Stack_20[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (this->innerconstraint2).
           super___shared_ptr<chrono::ChShaftsBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->innerconstraint2).super___shared_ptr<chrono::ChShaftsBody,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = pCVar2;
  (this->innerconstraint2).super___shared_ptr<chrono::ChShaftsBody,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var3._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  if (a_Stack_20[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_20[0]._M_pi);
  }
  return;
}

Assistant:

ChLinkMotorRotationDriveline::ChLinkMotorRotationDriveline() {
    this->c_rz = false;
    SetupLinkMask();

    innershaft1 = chrono_types::make_shared<ChShaft>();
    innershaft2 = chrono_types::make_shared<ChShaft>();
    innerconstraint1 = chrono_types::make_shared<ChShaftsBody>();
    innerconstraint2 = chrono_types::make_shared<ChShaftsBody>();
}